

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t FSE_normalizeCount(short *normalizedCounter,uint tableLog,uint *count,size_t total,
                         uint maxSymbolValue)

{
  undefined1 auVar1 [16];
  char cVar2;
  byte bVar3;
  short sVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  ushort uVar8;
  size_t sVar9;
  short *psVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  
  uVar18 = 0xb;
  if (tableLog != 0) {
    uVar18 = tableLog;
  }
  sVar9 = 0xffffffffffffffff;
  if ((4 < uVar18) && (sVar9 = 0xffffffffffffffd4, uVar18 < 0xd)) {
    uVar5 = FSE_minTableLog(total,maxSymbolValue);
    sVar9 = 0xffffffffffffffff;
    if (uVar5 <= uVar18) {
      bVar3 = (byte)uVar18;
      cVar2 = -bVar3;
      bVar7 = cVar2 + 0x3e;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = total;
      uVar11 = 1 << (bVar3 & 0x1f);
      sVar9 = (size_t)uVar18;
      uVar6 = 0;
      uVar5 = 0;
      uVar17 = 0;
      uVar18 = uVar11;
      do {
        uVar12 = (ulong)count[uVar17];
        if (uVar12 == total) {
          return 0;
        }
        uVar13 = (uint)(total >> (bVar3 & 0x3f));
        if (uVar12 == 0) {
          normalizedCounter[uVar17] = 0;
        }
        else if (uVar13 < count[uVar17]) {
          uVar12 = uVar12 * SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x4000000000000000)) / auVar1,0);
          uVar15 = uVar12 >> (bVar7 & 0x3f);
          if ((uVar15 & 0xfff8) == 0) {
            uVar15 = (ulong)((int)uVar15 +
                            (uint)((ulong)FSE_normalizeCount::rtbTable[uVar15 & 0xffff] <<
                                   (cVar2 + 0x2aU & 0x3f) <
                                  uVar12 - ((uVar15 & 0xffff) << (bVar7 & 0x3f))));
          }
          uVar8 = (ushort)uVar15;
          if ((ushort)uVar6 < uVar8) {
            uVar5 = uVar17;
          }
          if ((ushort)uVar6 < uVar8) {
            uVar6 = uVar15 & 0xffff;
          }
          normalizedCounter[uVar17] = uVar8;
          uVar18 = uVar18 - (int)(uVar15 & 0xffff);
        }
        else {
          normalizedCounter[uVar17] = -1;
          uVar18 = uVar18 - 1;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 <= maxSymbolValue);
      sVar4 = normalizedCounter[uVar5];
      iVar14 = (int)sVar4 >> 1;
      if (iVar14 == -uVar18 || SBORROW4(iVar14,-uVar18) != (int)(iVar14 + uVar18) < 0) {
        uVar15 = total * 3 >> (bVar3 + 1 & 0x3f);
        uVar12 = (ulong)(maxSymbolValue + 1);
        uVar6 = 0;
        uVar5 = 0;
        do {
          uVar18 = count[uVar6];
          if ((ulong)uVar18 == 0) {
            normalizedCounter[uVar6] = 0;
          }
          else {
            if (uVar13 < uVar18) {
              if ((uint)uVar15 < uVar18) {
                normalizedCounter[uVar6] = -2;
                goto LAB_0010eb33;
              }
              normalizedCounter[uVar6] = 1;
            }
            else {
              normalizedCounter[uVar6] = -1;
            }
            uVar5 = uVar5 + 1;
            total = total - uVar18;
          }
LAB_0010eb33:
          uVar6 = uVar6 + 1;
        } while (uVar12 != uVar6);
        uVar18 = uVar11 - uVar5;
        if (uVar18 == 0) {
          return sVar9;
        }
        if ((uVar15 & 0xffffffff) < total / uVar18) {
          uVar6 = total * 3;
          uVar15 = 0;
          do {
            if ((normalizedCounter[uVar15] == -2) &&
               (uVar17 = count[uVar15], uVar17 <= (uint)(uVar6 / (uVar18 * 2)))) {
              normalizedCounter[uVar15] = 1;
              uVar5 = uVar5 + 1;
              total = total - uVar17;
            }
            uVar15 = uVar15 + 1;
          } while (uVar12 != uVar15);
          uVar18 = uVar11 - uVar5;
        }
        if (uVar5 != maxSymbolValue + 1) {
          if (total == 0) {
            if (uVar18 == 0) {
              return sVar9;
            }
            uVar6 = 0;
            do {
              if (0 < normalizedCounter[uVar6]) {
                uVar18 = uVar18 - 1;
                normalizedCounter[uVar6] = normalizedCounter[uVar6] + 1;
              }
              uVar5 = (uint)uVar6;
              uVar6 = (ulong)(uVar5 + 1);
              if (uVar5 == maxSymbolValue) {
                uVar6 = 0;
              }
            } while (uVar18 != 0);
            return sVar9;
          }
          uVar12 = ~(-1L << (cVar2 + 0x3dU & 0x3f));
          uVar5 = 0;
          uVar6 = uVar12;
          do {
            uVar15 = uVar6;
            if (normalizedCounter[uVar5] == -2) {
              uVar15 = (ulong)count[uVar5] * ((((ulong)uVar18 << (bVar7 & 0x3f)) + uVar12) / total)
                       + uVar6;
              uVar6 = uVar6 >> (bVar7 & 0x3f);
              uVar16 = uVar15 >> (bVar7 & 0x3f);
              if (uVar16 == uVar6) {
                return 0xffffffffffffffff;
              }
              normalizedCounter[uVar5] = (short)uVar16 - (short)uVar6;
            }
            uVar5 = uVar5 + 1;
            uVar6 = uVar15;
          } while (uVar5 <= maxSymbolValue);
          return sVar9;
        }
        uVar15 = 0;
        uVar5 = 0;
        uVar6 = 0;
        do {
          if (uVar5 < count[uVar15]) {
            uVar6 = uVar15 & 0xffffffff;
            uVar5 = count[uVar15];
          }
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
        psVar10 = normalizedCounter + uVar6;
        sVar4 = *psVar10;
      }
      else {
        psVar10 = normalizedCounter + uVar5;
      }
      *psVar10 = sVar4 + (short)uVar18;
    }
  }
  return sVar9;
}

Assistant:

size_t FSE_normalizeCount (short* normalizedCounter, unsigned tableLog,
                           const unsigned* count, size_t total,
                           unsigned maxSymbolValue)
{
    /* Sanity checks */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported size */
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported size */
    if (tableLog < FSE_minTableLog(total, maxSymbolValue)) return ERROR(GENERIC);   /* Too small tableLog, compression potentially impossible */

    {   static U32 const rtbTable[] = {     0, 473195, 504333, 520860, 550000, 700000, 750000, 830000 };
        U64 const scale = 62 - tableLog;
        U64 const step = ((U64)1<<62) / total;   /* <== here, one division ! */
        U64 const vStep = 1ULL<<(scale-20);
        int stillToDistribute = 1<<tableLog;
        unsigned s;
        unsigned largest=0;
        short largestP=0;
        U32 lowThreshold = (U32)(total >> tableLog);

        for (s=0; s<=maxSymbolValue; s++) {
            if (count[s] == total) return 0;   /* rle special case */
            if (count[s] == 0) { normalizedCounter[s]=0; continue; }
            if (count[s] <= lowThreshold) {
                normalizedCounter[s] = -1;
                stillToDistribute--;
            } else {
                short proba = (short)((count[s]*step) >> scale);
                if (proba<8) {
                    U64 restToBeat = vStep * rtbTable[proba];
                    proba += (count[s]*step) - ((U64)proba<<scale) > restToBeat;
                }
                if (proba > largestP) { largestP=proba; largest=s; }
                normalizedCounter[s] = proba;
                stillToDistribute -= proba;
        }   }
        if (-stillToDistribute >= (normalizedCounter[largest] >> 1)) {
            /* corner case, need another normalization method */
            size_t const errorCode = FSE_normalizeM2(normalizedCounter, tableLog, count, total, maxSymbolValue);
            if (FSE_isError(errorCode)) return errorCode;
        }
        else normalizedCounter[largest] += (short)stillToDistribute;
    }

#if 0
    {   /* Print Table (debug) */
        U32 s;
        U32 nTotal = 0;
        for (s=0; s<=maxSymbolValue; s++)
            RAWLOG(2, "%3i: %4i \n", s, normalizedCounter[s]);
        for (s=0; s<=maxSymbolValue; s++)
            nTotal += abs(normalizedCounter[s]);
        if (nTotal != (1U<<tableLog))
            RAWLOG(2, "Warning !!! Total == %u != %u !!!", nTotal, 1U<<tableLog);
        getchar();
    }
#endif

    return tableLog;
}